

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall sptk::reaper::EpochTracker::WriteDiagnostics(EpochTracker *this,string *file_base)

{
  int iVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar3;
  char *__filename;
  FILE *__stream;
  reference pvVar4;
  string *in_RDI;
  float fVar5;
  float time;
  int32_t i;
  int32_t limit;
  vector<float,_std::allocator<float>_> f0;
  FILE *pmfile;
  string pm_name;
  string *in_stack_fffffffffffffd48;
  EpochTracker *in_stack_fffffffffffffd50;
  allocator *paVar6;
  string *__x;
  FILE *this_00;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe00;
  EpochTracker *in_stack_fffffffffffffe08;
  int local_1d0;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    set_debug_name(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"pcm",&local_31);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"resid",&local_69);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"nresid",&local_91);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"bprms",&local_b9);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"onsetp",&local_e1);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"offsetp",&local_109);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"pvals",&local_131);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  __lhs = in_RDI + 0xe0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"pvoiced",&local_159);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  paVar6 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"bestcorr",paVar6);
  WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    sVar3 = std::
            vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
            ::size((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                    *)(in_RDI + 0x20));
    if (2 < sVar3) {
      __x = local_1a8;
      std::operator+(__lhs,(char *)paVar6);
      __filename = (char *)std::__cxx11::string::c_str();
      __stream = fopen(__filename,"w");
      this_00 = __stream;
      fprintf(__stream,"#\n");
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1251fe);
      sVar3 = std::
              vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
              ::size((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      *)(in_RDI + 0x20));
      iVar1 = (int)sVar3 + -1;
      for (local_1d0 = iVar1; -1 < local_1d0; local_1d0 = local_1d0 + -1) {
        pvVar4 = std::
                 vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               *)(in_RDI + 0x20),(long)local_1d0);
        fVar5 = (float)pvVar4->resid_index / *(float *)(in_RDI + 0x128);
        pvVar4 = std::
                 vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               *)(in_RDI + 0x20),(long)local_1d0);
        if ((pvVar4->voiced & 1U) == 0) {
          if (local_1d0 < iVar1) {
            pvVar4 = std::
                     vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                   *)(in_RDI + 0x20),(long)(local_1d0 + 1));
            if ((pvVar4->voiced & 1U) != 0) goto LAB_001252be;
          }
          fprintf(__stream,"%f red \n",(double)fVar5);
        }
        else {
LAB_001252be:
          fprintf(__stream,"%f blue \n",(double)fVar5);
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)this_00,(value_type_conflict2 *)__x);
        std::
        vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
        ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      *)(in_RDI + 0x20),(long)local_1d0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)this_00,(value_type_conflict2 *)__x);
        std::
        vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
        ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      *)(in_RDI + 0x20),(long)local_1d0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)this_00,(value_type_conflict2 *)__x);
      }
      fclose(__stream);
      paVar6 = (allocator *)&stack0xfffffffffffffe07;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffe08,"f0ap",paVar6);
      WriteDebugData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_RDI);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this_00);
      std::__cxx11::string::~string(local_1a8);
    }
  }
  return true;
}

Assistant:

bool EpochTracker::WriteDiagnostics(const std::string& file_base) {
  if (!file_base.empty()) {
    set_debug_name(file_base);
  }
  WriteDebugData(signal_, "pcm");
  WriteDebugData(residual_, "resid");
  WriteDebugData(norm_residual_, "nresid");
  WriteDebugData(bandpassed_rms_, "bprms");
  WriteDebugData(voice_onset_prob_, "onsetp");
  WriteDebugData(voice_offset_prob_, "offsetp");
  WriteDebugData(peaks_debug_, "pvals");
  WriteDebugData(prob_voiced_, "pvoiced");
  // best_corr_ is only available after CreatePeriodLattice.
  WriteDebugData(best_corr_, "bestcorr");
  // NOTE: if WriteDiagnostics is called before the
  // DynamicProgramming, there will be nothing in output_.
  if ((!debug_name_.empty()) && (output_.size() > 2)) {
    std::string pm_name = debug_name_ + ".pmlab";
    FILE* pmfile = fopen(pm_name.c_str(), "w");
    fprintf(pmfile, "#\n");
    std::vector<float> f0;
    int32_t limit = output_.size() - 1;
    // Produce debug output in normal time order.
    for (int32_t i = limit; i >= 0; --i) {
      float time = output_[i].resid_index / sample_rate_;
      // Note that the pulse locations of both the beginning and end
      // of any voiced period are of interest.
      if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
        fprintf(pmfile, "%f blue \n", time);
      } else {
        fprintf(pmfile, "%f red \n", time);
      }
      f0.push_back(time);
      f0.push_back(output_[i].f0);
      f0.push_back(output_[i].nccf_value);
    }
    fclose(pmfile);
    WriteDebugData(f0, "f0ap");
  }
  return true;
}